

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log4z.cpp
# Opt level: O2

bool zsummer::log4z::TimeToTm(time_t *t,tm *tt)

{
  tm *ptVar1;
  
  ptVar1 = localtime_r(t,(tm *)tt);
  return ptVar1 != (tm *)0x0;
}

Assistant:

bool TimeToTm(const time_t &t, tm * tt)
{
#ifdef WIN32
    *tt = *localtime(&t);
    return true;
#else
	if (localtime_r(&t, tt) != NULL)
	{
		return true;
	}
	return false;
#endif
}